

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O2

void __thiscall HSimplexNla::clear(HSimplexNla *this)

{
  this->report_ = false;
  this->build_synthetic_tick_ = 0.0;
  this->lp_ = (HighsLp *)0x0;
  this->scale_ = (HighsScale *)0x0;
  this->basic_index_ = (HighsInt *)0x0;
  this->options_ = (HighsOptions *)0x0;
  this->timer_ = (HighsTimer *)0x0;
  this->analysis_ = (HighsSimplexAnalysis *)0x0;
  return;
}

Assistant:

void HSimplexNla::clear() {
  lp_ = NULL;
  scale_ = NULL;
  basic_index_ = NULL;
  options_ = NULL;
  timer_ = NULL;
  analysis_ = NULL;
  report_ = false;
  build_synthetic_tick_ = 0;
}